

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pagerAddPageToRollbackJournal(PgHdr *pPg)

{
  void *pvVar1;
  Pager *pPager;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  u32 cksum;
  u32 uVar5;
  long lVar6;
  char ac [4];
  char ac_1 [4];
  uint local_30;
  uint local_2c;
  
  pvVar1 = pPg->pData;
  pPager = pPg->pPager;
  lVar6 = pPager->journalOff;
  uVar5 = pPager->cksumInit;
  if (200 < (long)pPager->pageSize) {
    uVar4 = (long)pPager->pageSize + 200;
    do {
      uVar5 = uVar5 + *(byte *)((long)pvVar1 + (uVar4 - 400));
      uVar4 = uVar4 - 200;
    } while (400 < uVar4);
  }
  *(byte *)&pPg->flags = (byte)pPg->flags | 8;
  uVar2 = pPg->pgno;
  local_30 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar2 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,&local_30,4,lVar6);
  if (uVar2 == 0) {
    lVar6 = lVar6 + 4;
    uVar2 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,pvVar1,pPager->pageSize,lVar6);
    if (uVar2 == 0) {
      local_2c = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      uVar2 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,&local_2c,4,lVar6 + pPager->pageSize);
      if (uVar2 == 0) {
        pPager->journalOff = (long)pPager->pageSize + pPager->journalOff + 8;
        pPager->nRec = pPager->nRec + 1;
        uVar3 = sqlite3BitvecSet(pPager->pInJournal,pPg->pgno);
        uVar2 = addToSavepointBitvecs(pPager,pPg->pgno);
        uVar2 = uVar2 | uVar3;
      }
    }
  }
  return uVar2;
}

Assistant:

static SQLITE_NOINLINE int pagerAddPageToRollbackJournal(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  int rc;
  u32 cksum;
  char *pData2;
  i64 iOff = pPager->journalOff;

  /* We should never write to the journal file the page that
  ** contains the database locks.  The following assert verifies
  ** that we do not. */
  assert( pPg->pgno!=PAGER_MJ_PGNO(pPager) );

  assert( pPager->journalHdr<=pPager->journalOff );
  CODEC2(pPager, pPg->pData, pPg->pgno, 7, return SQLITE_NOMEM_BKPT, pData2);
  cksum = pager_cksum(pPager, (u8*)pData2);

  /* Even if an IO or diskfull error occurs while journalling the
  ** page in the block above, set the need-sync flag for the page.
  ** Otherwise, when the transaction is rolled back, the logic in
  ** playback_one_page() will think that the page needs to be restored
  ** in the database file. And if an IO error occurs while doing so,
  ** then corruption may follow.
  */
  pPg->flags |= PGHDR_NEED_SYNC;

  rc = write32bits(pPager->jfd, iOff, pPg->pgno);
  if( rc!=SQLITE_OK ) return rc;
  rc = sqlite3OsWrite(pPager->jfd, pData2, pPager->pageSize, iOff+4);
  if( rc!=SQLITE_OK ) return rc;
  rc = write32bits(pPager->jfd, iOff+pPager->pageSize+4, cksum);
  if( rc!=SQLITE_OK ) return rc;

  IOTRACE(("JOUT %p %d %lld %d\n", pPager, pPg->pgno, 
           pPager->journalOff, pPager->pageSize));
  PAGER_INCR(sqlite3_pager_writej_count);
  PAGERTRACE(("JOURNAL %d page %d needSync=%d hash(%08x)\n",
       PAGERID(pPager), pPg->pgno, 
       ((pPg->flags&PGHDR_NEED_SYNC)?1:0), pager_pagehash(pPg)));

  pPager->journalOff += 8 + pPager->pageSize;
  pPager->nRec++;
  assert( pPager->pInJournal!=0 );
  rc = sqlite3BitvecSet(pPager->pInJournal, pPg->pgno);
  testcase( rc==SQLITE_NOMEM );
  assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
  rc |= addToSavepointBitvecs(pPager, pPg->pgno);
  assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
  return rc;
}